

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int parsedate(char *date,time_t *output)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  int *piVar5;
  long lVar6;
  int local_dc;
  int local_d8;
  long delta;
  int old_errno;
  int error;
  long lval;
  char *end;
  size_t sStack_a0;
  int val;
  size_t len;
  char buf [32];
  _Bool found;
  int part;
  char *indate;
  undefined1 local_60 [4];
  assume dignext;
  my_tm tm;
  int tzoff;
  int yearnum;
  int secnum;
  int minnum;
  int hournum;
  int mdaynum;
  int monnum;
  int wdaynum;
  time_t t;
  time_t *output_local;
  char *date_local;
  
  _monnum = 0;
  mdaynum = -1;
  hournum = -1;
  minnum = -1;
  secnum = -1;
  yearnum = -1;
  tzoff = -1;
  tm.tm_year = -1;
  tm.tm_mon = -1;
  bVar2 = false;
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  t = (time_t)output;
  output_local = (time_t *)date;
  do {
    if ((char)*output_local == '\0' || 5 < (int)buf._28_4_) {
      if (tzoff == -1) {
        secnum = 0;
        yearnum = 0;
        tzoff = 0;
      }
      if (((minnum == -1) || (hournum == -1)) || (tm.tm_year == -1)) {
        date_local._4_4_ = -1;
      }
      else if (tm.tm_year < 0x7b2) {
        *(undefined8 *)t = 0;
        date_local._4_4_ = 2;
      }
      else if ((((minnum < 0x20) && (hournum < 0xc)) && (secnum < 0x18)) &&
              ((yearnum < 0x3c && (tzoff < 0x3d)))) {
        local_60 = (undefined1  [4])tzoff;
        dignext = yearnum;
        tm.tm_sec = secnum;
        tm.tm_min = minnum;
        tm.tm_hour = hournum;
        tm.tm_mday = tm.tm_year + -0x76c;
        _monnum = my_timegm((my_tm *)local_60);
        if ((int)_monnum != -1) {
          if (tm.tm_mon == -1) {
            local_dc = 0;
          }
          else {
            local_dc = tm.tm_mon;
          }
          lVar6 = (long)local_dc;
          if ((0 < lVar6) && (0x7fffffffffffffff - lVar6 < _monnum)) {
            *(undefined8 *)t = 0x7fffffff;
            return 1;
          }
          _monnum = lVar6 + _monnum;
        }
        *(time_t *)t = _monnum;
        date_local._4_4_ = 0;
      }
      else {
        date_local._4_4_ = -1;
      }
      return date_local._4_4_;
    }
    buf[0x1b] = '\0';
    skip((char **)&output_local);
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[(int)(uint)(byte)*output_local] & 0x400) == 0) {
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)(uint)(byte)*output_local] & 0x800) != 0) {
        if ((tzoff == -1) &&
           (iVar3 = __isoc99_sscanf(output_local,"%02d:%02d:%02d",&secnum,&yearnum,&tzoff),
           iVar3 == 3)) {
          output_local = output_local + 1;
        }
        else if ((tzoff == -1) &&
                (iVar3 = __isoc99_sscanf(output_local,"%02d:%02d",&secnum,&yearnum), iVar3 == 2)) {
          output_local = (time_t *)((long)output_local + 5);
          tzoff = 0;
        }
        else {
          piVar5 = __errno_location();
          iVar3 = *piVar5;
          piVar5 = __errno_location();
          *piVar5 = 0;
          lVar6 = strtol((char *)output_local,(char **)&lval,10);
          piVar5 = __errno_location();
          iVar1 = *piVar5;
          if (iVar1 != iVar3) {
            piVar5 = __errno_location();
            *piVar5 = iVar3;
          }
          if (iVar1 != 0) {
            return -1;
          }
          if ((0x7fffffff < lVar6) || (lVar6 < -0x80000000)) {
            return -1;
          }
          end._4_4_ = curlx_sltosi(lVar6);
          if (((((tm.tm_mon == -1) && (lval - (long)output_local == 4)) && (end._4_4_ < 0x579)) &&
              (date < output_local)) &&
             ((*(char *)((long)output_local + -1) == '+' ||
              (*(char *)((long)output_local + -1) == '-')))) {
            buf[0x1b] = '\x01';
            iVar3 = (end._4_4_ / 100) * 0x3c + end._4_4_ % 100;
            local_d8 = iVar3 * 0x3c;
            if (*(char *)((long)output_local + -1) == '+') {
              local_d8 = iVar3 * -0x3c;
            }
            tm.tm_mon = local_d8;
          }
          if (((lval - (long)output_local == 8) && (tm.tm_year == -1)) &&
             ((hournum == -1 && (minnum == -1)))) {
            buf[0x1b] = '\x01';
            tm.tm_year = end._4_4_ / 10000;
            hournum = (int)((long)((ulong)(uint)((int)((long)end._4_4_ % 10000) >> 0x1f) << 0x20 |
                                  (long)end._4_4_ % 10000 & 0xffffffffU) / 100) + -1;
            minnum = end._4_4_ % 100;
          }
          if ((((buf[0x1b] & 1U) == 0) && (!bVar2)) && (minnum == -1)) {
            if ((0 < end._4_4_) && (end._4_4_ < 0x20)) {
              buf[0x1b] = '\x01';
              minnum = end._4_4_;
            }
            bVar2 = true;
          }
          if ((((buf[0x1b] & 1U) == 0) && (bVar2)) && (tm.tm_year == -1)) {
            buf[0x1b] = '\x01';
            tm.tm_year = end._4_4_;
            if (end._4_4_ < 0x76c) {
              if (end._4_4_ < 0x47) {
                tm.tm_year = end._4_4_ + 2000;
              }
              else {
                tm.tm_year = end._4_4_ + 0x76c;
              }
            }
            if (minnum == -1) {
              bVar2 = false;
            }
          }
          if ((buf[0x1b] & 1U) == 0) {
            return -1;
          }
          output_local = (time_t *)lval;
        }
      }
    }
    else {
      memset(&len,0,0x20);
      iVar3 = __isoc99_sscanf(output_local,
                              "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",&len);
      if (iVar3 == 0) {
        sStack_a0 = 0;
      }
      else {
        sStack_a0 = strlen((char *)&len);
      }
      if ((mdaynum == -1) && (mdaynum = checkday((char *)&len,sStack_a0), mdaynum != -1)) {
        buf[0x1b] = '\x01';
      }
      if ((((buf[0x1b] & 1U) == 0) && (hournum == -1)) &&
         (hournum = checkmonth((char *)&len), hournum != -1)) {
        buf[0x1b] = '\x01';
      }
      if ((((buf[0x1b] & 1U) == 0) && (tm.tm_mon == -1)) &&
         (tm.tm_mon = checktz((char *)&len), tm.tm_mon != -1)) {
        buf[0x1b] = '\x01';
      }
      if ((buf[0x1b] & 1U) == 0) {
        return -1;
      }
      output_local = (time_t *)(sStack_a0 + (long)output_local);
    }
    buf._28_4_ = buf._28_4_ + 1;
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum=-1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum=-1;   /* month of the year number, 0-11 */
  int mdaynum=-1; /* day of month, 1 - 31 */
  int hournum=-1;
  int minnum=-1;
  int secnum=-1;
  int yearnum=-1;
  int tzoff=-1;
  struct my_tm tm;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found=FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d", &hournum, &minnum, &secnum))) {
        /* time stamp! */
        date += 8;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d", &hournum, &minnum))) {
        /* time stamp without seconds */
        date += 5;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = ERRNO;
        SET_ERRNO(0);
        lval = strtol(date, &end, 10);
        error = ERRNO;
        if(error != old_errno)
          SET_ERRNO(old_errno);

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need ther reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 1900) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#if SIZEOF_TIME_T < 5
  /* 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = 0x7fffffff;
    return PARSEDATE_LATER;
  }
#endif

  if(yearnum < 1970) {
    *output = 0;
    return PARSEDATE_SOONER;
  }

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  tm.tm_sec = secnum;
  tm.tm_min = minnum;
  tm.tm_hour = hournum;
  tm.tm_mday = mdaynum;
  tm.tm_mon = monnum;
  tm.tm_year = yearnum - 1900;

  /* my_timegm() returns a time_t. time_t is often 32 bits, even on many
     architectures that feature 64 bit 'long'.

     Some systems have 64 bit time_t and deal with years beyond 2038. However,
     even on some of the systems with 64 bit time_t mktime() returns -1 for
     dates beyond 03:14:07 UTC, January 19, 2038. (Such as AIX 5100-06)
  */
  t = my_timegm(&tm);

  /* time zone adjust (cast t to int to compare to negative one) */
  if(-1 != (int)t) {

    /* Add the time zone diff between local time zone and GMT. */
    long delta = (long)(tzoff!=-1?tzoff:0);

    if((delta>0) && (t > LONG_MAX - delta)) {
      *output = 0x7fffffff;
      return PARSEDATE_LATER; /* time_t overflow */
    }

    t += delta;
  }

  *output = t;

  return PARSEDATE_OK;
}